

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

Iterator * leveldb::NewMergingIterator(Comparator *comparator,Iterator **children,int n)

{
  int n_local;
  Iterator **children_local;
  Comparator *comparator_local;
  
  if (-1 < n) {
    if (n == 0) {
      comparator_local = (Comparator *)NewEmptyIterator();
    }
    else if (n == 1) {
      comparator_local = (Comparator *)*children;
    }
    else {
      comparator_local = (Comparator *)operator_new(0x50);
      anon_unknown_0::MergingIterator::MergingIterator
                ((MergingIterator *)comparator_local,comparator,children,n);
    }
    return (Iterator *)comparator_local;
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/merger.cc"
                ,0xb5,"Iterator *leveldb::NewMergingIterator(const Comparator *, Iterator **, int)")
  ;
}

Assistant:

Iterator* NewMergingIterator(const Comparator* comparator, Iterator** children,
                             int n) {
  assert(n >= 0);
  if (n == 0) {
    return NewEmptyIterator();
  } else if (n == 1) {
    return children[0];
  } else {
    return new MergingIterator(comparator, children, n);
  }
}